

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cIA,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  BYTE BVar7;
  int iVar8;
  int iVar9;
  BYTE *pBVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063e955_caseD_0:
    if (0 < count) {
      lVar6 = 0;
      do {
        bVar2 = pin[1];
        if (bVar2 != 0) {
          iVar9 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar6 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar9;
          pout[lVar6 * 4 + 3] = bVar2;
        }
        pin = pin + step;
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063e955_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pBVar10 = pin + 1;
        lVar6 = 0;
        do {
          BVar1 = *pBVar10;
          if (BVar1 != '\0') {
            bVar2 = pBVar10[-1] >> 4;
            iVar9 = (int)((uint)IcePalette[bVar2][0] * inf->alpha +
                         (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar6 * 4 + 2] = (BYTE)iVar9;
            iVar9 = (int)((uint)IcePalette[bVar2][1] * inf->alpha +
                         (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar6 * 4 + 1] = (BYTE)iVar9;
            iVar9 = (int)((uint)IcePalette[bVar2][2] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000)
                    >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar6 * 4] = (BYTE)iVar9;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar10 = pBVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pBVar10 = pin + 1;
        lVar6 = 0;
        do {
          BVar1 = *pBVar10;
          if (BVar1 != '\0') {
            iVar12 = (uint)pBVar10[-1] * inf->blendcolor[3];
            iVar9 = inf->blendcolor[1];
            iVar4 = inf->blendcolor[2];
            iVar8 = ((uint)(inf->blendcolor[0] + iVar12) >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar6 * 4 + 2] * 0x10000;
            BVar7 = (BYTE)((uint)iVar8 >> 0x10);
            if (0xfe < iVar8 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 2] = BVar7;
            iVar9 = ((uint)(iVar9 + iVar12) >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar6 * 4 + 1] * 0x10000;
            BVar7 = (BYTE)((uint)iVar9 >> 0x10);
            if (0xfe < iVar9 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 1] = BVar7;
            iVar9 = ((uint)(iVar12 + iVar4) >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar6 * 4] * 0x10000;
            BVar7 = (BYTE)((uint)iVar9 >> 0x10);
            if (0xfe < iVar9 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4] = BVar7;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar10 = pBVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pBVar10 = pin + 1;
        lVar6 = 0;
        do {
          BVar1 = *pBVar10;
          if (BVar1 != '\0') {
            bVar2 = pBVar10[-1];
            iVar9 = (int)((inf->blendcolor[0] * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            iVar4 = inf->blendcolor[1];
            iVar8 = inf->blendcolor[2];
            pout[lVar6 * 4 + 2] = (BYTE)iVar9;
            iVar9 = (int)((iVar4 * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar6 * 4 + 1] = (BYTE)iVar9;
            iVar9 = (int)(((uint)bVar2 * iVar8 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar6 * 4] = (BYTE)iVar9;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar10 = pBVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    default:
      lVar6 = (long)inf->blend;
      if (lVar6 < 0x21) {
        if (0 < count && BLEND_ICEMAP < inf->blend) {
          pBVar10 = pin + 1;
          lVar6 = 0;
          do {
            BVar1 = *pBVar10;
            if (BVar1 != '\0') {
              bVar2 = pBVar10[-1];
              iVar9 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              pout[lVar6 * 4 + 2] = (BYTE)iVar9;
              iVar9 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              pout[lVar6 * 4 + 1] = (BYTE)iVar9;
              iVar9 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              pout[lVar6 * 4] = (BYTE)iVar9;
              pout[lVar6 * 4 + 3] = BVar1;
            }
            lVar6 = lVar6 + 1;
            pBVar10 = pBVar10 + step;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        pBVar10 = pin + 1;
        lVar11 = 0;
        do {
          BVar1 = *pBVar10;
          if (BVar1 != '\0') {
            uVar13 = (ulong)pBVar10[-1];
            iVar9 = (int)((uint)*(byte *)((long)pFVar5 + uVar13 * 4 + lVar6 * 0x518 + -0xa6fe) *
                          inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            bVar2 = *(byte *)((long)pFVar5 + uVar13 * 4 + lVar6 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar5 + uVar13 * 4 + lVar6 * 0x518 + -0xa6ff);
            pout[lVar11 * 4 + 2] = (BYTE)iVar9;
            iVar9 = (int)((uint)bVar3 * inf->alpha + (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar11 * 4 + 1] = (BYTE)iVar9;
            iVar9 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar11 * 4] = (BYTE)iVar9;
            pout[lVar11 * 4 + 3] = BVar1;
          }
          lVar11 = lVar11 + 1;
          pBVar10 = pBVar10 + step;
        } while (count != (int)lVar11);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}